

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NFA.hpp
# Opt level: O0

void __thiscall
Centaurus::NFABaseState<char,_int>::print_subgraph
          (NFABaseState<char,_int> *this,wostream *os,int from,wstring *prefix)

{
  bool bVar1;
  int iVar2;
  reference this_00;
  wostream *pwVar3;
  CharClass<char> *cc;
  NFATransition<char> *t;
  const_iterator __end0;
  const_iterator __begin0;
  vector<Centaurus::NFATransition<char>,_std::allocator<Centaurus::NFATransition<char>_>_> *__range2
  ;
  wstring *prefix_local;
  int from_local;
  wostream *os_local;
  NFABaseState<char,_int> *this_local;
  
  __end0 = std::
           vector<Centaurus::NFATransition<char>,_std::allocator<Centaurus::NFATransition<char>_>_>
           ::begin(&this->m_transitions);
  t = (NFATransition<char> *)
      std::vector<Centaurus::NFATransition<char>,_std::allocator<Centaurus::NFATransition<char>_>_>
      ::end(&this->m_transitions);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end0,(__normal_iterator<const_Centaurus::NFATransition<char>_*,_std::vector<Centaurus::NFATransition<char>,_std::allocator<Centaurus::NFATransition<char>_>_>_>
                                *)&t);
    if (!bVar1) break;
    this_00 = __gnu_cxx::
              __normal_iterator<const_Centaurus::NFATransition<char>_*,_std::vector<Centaurus::NFATransition<char>,_std::allocator<Centaurus::NFATransition<char>_>_>_>
              ::operator*(&__end0);
    pwVar3 = std::operator<<(os,(wstring *)prefix);
    pwVar3 = std::operator<<(pwVar3,L"_S");
    pwVar3 = (wostream *)std::wostream::operator<<(pwVar3,from);
    pwVar3 = std::operator<<(pwVar3,L" -> ");
    pwVar3 = std::operator<<(pwVar3,(wstring *)prefix);
    pwVar3 = std::operator<<(pwVar3,L"_S");
    iVar2 = NFATransition<char>::dest(this_00);
    pwVar3 = (wostream *)std::wostream::operator<<(pwVar3,iVar2);
    std::operator<<(pwVar3,L" [ label=\"");
    cc = NFATransition<char>::label(this_00);
    Centaurus::operator<<(os,cc);
    bVar1 = NFATransition<char>::is_long(this_00);
    if (bVar1) {
      pwVar3 = std::operator<<(os,L"\", penwidth=3, arrowsize=3 ];");
      std::wostream::operator<<(pwVar3,std::endl<wchar_t,std::char_traits<wchar_t>>);
    }
    else {
      pwVar3 = std::operator<<(os,L"\" ];");
      std::wostream::operator<<(pwVar3,std::endl<wchar_t,std::char_traits<wchar_t>>);
    }
    __gnu_cxx::
    __normal_iterator<const_Centaurus::NFATransition<char>_*,_std::vector<Centaurus::NFATransition<char>,_std::allocator<Centaurus::NFATransition<char>_>_>_>
    ::operator++(&__end0);
  }
  return;
}

Assistant:

void print_subgraph(std::wostream& os, int from, const std::wstring& prefix) const
	{
		for (const auto& t : m_transitions)
		{
			os << prefix << L"_S" << from << L" -> " << prefix << L"_S" << t.dest() << L" [ label=\"";
			os << t.label();
            if (!t.is_long())
            {
                os << L"\" ];" << std::endl;
            }
            else
            {
                os << L"\", penwidth=3, arrowsize=3 ];" << std::endl;
            }
		}
	}